

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiJittered.cpp
# Opt level: O0

void __thiscall pm::MultiJittered::generateSamples(MultiJittered *this)

{
  float fVar1;
  int iVar2;
  reference pvVar3;
  float fVar4;
  float fVar5;
  float t_1;
  uint k_1;
  uint j_2;
  uint i_3;
  uint p_2;
  float t;
  uint k;
  uint j_1;
  uint i_2;
  uint p_1;
  uint j;
  uint i_1;
  uint p;
  uint i;
  Vector2 fillPoint;
  float subcellWidth;
  uint n;
  MultiJittered *this_local;
  
  fVar4 = sqrtf((float)(this->super_Sampler).numSamples_);
  fillPoint.y = (float)(long)fVar4;
  fillPoint.x = 1.0 / (float)(this->super_Sampler).numSamples_;
  Vector2::Vector2((Vector2 *)&p);
  for (i_1 = 0; i_1 < (this->super_Sampler).numSamples_ * (this->super_Sampler).numSets_;
      i_1 = i_1 + 1) {
    std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::push_back
              (&(this->super_Sampler).samples_,(value_type *)&p);
  }
  for (j = 0; j < (this->super_Sampler).numSets_; j = j + 1) {
    for (p_1 = 0; p_1 < (uint)fillPoint.y; p_1 = p_1 + 1) {
      for (i_2 = 0; fVar4 = fillPoint.x, i_2 < (uint)fillPoint.y; i_2 = i_2 + 1) {
        iVar2 = p_1 * (int)fillPoint.y;
        fVar5 = Random::real(&(this->super_Sampler).rnd_);
        fVar5 = fVar5 * fillPoint.x;
        pvVar3 = std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::operator[]
                           (&(this->super_Sampler).samples_,
                            (ulong)(p_1 * (int)fillPoint.y + i_2 +
                                   j * (this->super_Sampler).numSamples_));
        fVar1 = fillPoint.x;
        pvVar3->x = (float)(iVar2 + i_2) * fVar4 + fVar5;
        iVar2 = i_2 * (int)fillPoint.y;
        fVar4 = Random::real(&(this->super_Sampler).rnd_);
        fVar4 = fVar4 * fillPoint.x;
        pvVar3 = std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::operator[]
                           (&(this->super_Sampler).samples_,
                            (ulong)(p_1 * (int)fillPoint.y + i_2 +
                                   j * (this->super_Sampler).numSamples_));
        pvVar3->y = (float)(iVar2 + p_1) * fVar1 + fVar4;
      }
    }
  }
  for (j_1 = 0; j_1 < (this->super_Sampler).numSets_; j_1 = j_1 + 1) {
    for (k = 0; k < (uint)fillPoint.y; k = k + 1) {
      for (t = 0.0; (uint)t < (uint)fillPoint.y; t = (float)((int)t + 1)) {
        fVar4 = Random::real(&(this->super_Sampler).rnd_);
        iVar2 = (int)(long)(fVar4 * (float)(~(uint)t + (int)fillPoint.y) + (float)(uint)t);
        pvVar3 = std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::operator[]
                           (&(this->super_Sampler).samples_,
                            (ulong)(k * (int)fillPoint.y + (int)t +
                                   j_1 * (this->super_Sampler).numSamples_));
        fVar4 = pvVar3->x;
        pvVar3 = std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::operator[]
                           (&(this->super_Sampler).samples_,
                            (ulong)(k * (int)fillPoint.y + iVar2 +
                                   j_1 * (this->super_Sampler).numSamples_));
        fVar1 = pvVar3->x;
        pvVar3 = std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::operator[]
                           (&(this->super_Sampler).samples_,
                            (ulong)(k * (int)fillPoint.y + (int)t +
                                   j_1 * (this->super_Sampler).numSamples_));
        pvVar3->x = fVar1;
        pvVar3 = std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::operator[]
                           (&(this->super_Sampler).samples_,
                            (ulong)(k * (int)fillPoint.y + iVar2 +
                                   j_1 * (this->super_Sampler).numSamples_));
        pvVar3->x = fVar4;
      }
    }
  }
  for (j_2 = 0; j_2 < (this->super_Sampler).numSets_; j_2 = j_2 + 1) {
    for (k_1 = 0; k_1 < (uint)fillPoint.y; k_1 = k_1 + 1) {
      for (t_1 = 0.0; (uint)t_1 < (uint)fillPoint.y; t_1 = (float)((int)t_1 + 1)) {
        fVar4 = Random::real(&(this->super_Sampler).rnd_);
        iVar2 = (int)(long)(fVar4 * (float)(~(uint)t_1 + (int)fillPoint.y) + (float)(uint)t_1);
        pvVar3 = std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::operator[]
                           (&(this->super_Sampler).samples_,
                            (ulong)((int)t_1 * (int)fillPoint.y + k_1 +
                                   j_2 * (this->super_Sampler).numSamples_));
        fVar4 = pvVar3->y;
        pvVar3 = std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::operator[]
                           (&(this->super_Sampler).samples_,
                            (ulong)(iVar2 * (int)fillPoint.y + k_1 +
                                   j_2 * (this->super_Sampler).numSamples_));
        fVar1 = pvVar3->y;
        pvVar3 = std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::operator[]
                           (&(this->super_Sampler).samples_,
                            (ulong)((int)t_1 * (int)fillPoint.y + k_1 +
                                   j_2 * (this->super_Sampler).numSamples_));
        pvVar3->y = fVar1;
        pvVar3 = std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::operator[]
                           (&(this->super_Sampler).samples_,
                            (ulong)(iVar2 * (int)fillPoint.y + k_1 +
                                   j_2 * (this->super_Sampler).numSamples_));
        pvVar3->y = fVar4;
      }
    }
  }
  return;
}

Assistant:

void MultiJittered::generateSamples(void)
{
	// num_samples needs to be a perfect square
	const unsigned int n = static_cast<unsigned int>(sqrtf(static_cast<float>(numSamples_)));
	const float subcellWidth = 1.0f / static_cast<float>(numSamples_);

	// fill the samples array with dummy points to allow us to use the [ ] notation
	// when we set the initial patterns

	Vector2 fillPoint;
	for (unsigned int i = 0; i < numSamples_ * numSets_; i++)
		samples_.push_back(fillPoint);

	// distribute points in the initial patterns
	for (unsigned int p = 0; p < numSets_; p++)
		for (unsigned int i = 0; i < n; i++)
			for (unsigned int j = 0; j < n; j++)
			{
				samples_[i * n + j + p * numSamples_].x = (i * n + j) * subcellWidth + rnd_.real() * subcellWidth;
				samples_[i * n + j + p * numSamples_].y = (j * n + i) * subcellWidth + rnd_.real() * subcellWidth;
			}

	// shuffle x coordinates
	for (unsigned int p = 0; p < numSets_; p++)
		for (unsigned int i = 0; i < n; i++)
			for (unsigned int j = 0; j < n; j++)
			{
				// random integer between j and n - 1
				const unsigned int k = static_cast<unsigned int>(rnd_.real() * (n - 1 - j) + j);
				const float t = samples_[i * n + j + p * numSamples_].x;
				samples_[i * n + j + p * numSamples_].x = samples_[i * n + k + p * numSamples_].x;
				samples_[i * n + k + p * numSamples_].x = t;
			}

	// shuffle y coordinates
	for (unsigned int p = 0; p < numSets_; p++)
		for (unsigned int i = 0; i < n; i++)
			for (unsigned int j = 0; j < n; j++)
			{
				// random integer between j and n - 1
				const int unsigned k = static_cast<unsigned int>(rnd_.real() * (n - 1 - j) + j);
				const float t = samples_[j * n + i + p * numSamples_].y;
				samples_[j * n + i + p * numSamples_].y = samples_[k * n + i + p * numSamples_].y;
				samples_[k * n + i + p * numSamples_].y = t;
			}
}